

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::samplers::Sampler_testRemotelyControlledSampler_Test::TestBody
          (Sampler_testRemotelyControlledSampler_Test *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  result_type_conflict rVar4;
  allocator local_1f81;
  undefined8 local_1f80;
  AssertionResult gtest_ar_;
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  metrics;
  Logger *local_1f60;
  undefined1 local_1f58 [32];
  TraceID traceID;
  string local_1f28;
  shared_ptr<jaegertracing::testutils::MockAgent> mockAgent;
  ProbabilisticSamplingStrategy probaStrategy;
  SamplingStrategyResponse config;
  RemotelyControlledSampler sampler;
  mt19937_64 rng;
  random_device device;
  
  testutils::MockAgent::make();
  jaegertracing::testutils::MockAgent::start();
  jaegertracing::logging::nullLogger();
  jaegertracing::metrics::Metrics::makeNullMetrics();
  _config = &thrift::Batch::vtable;
  jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::__set_strategyType
            ((type)&config);
  _probaStrategy = std::runtime_error::runtime_error;
  jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::__set_samplingRate(1.0);
  jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::__set_probabilisticSampling
            ((ProbabilisticSamplingStrategy *)&config);
  testutils::MockAgent::
  addSamplingStrategy<char_const(&)[13],jaegertracing::sampling_manager::thrift::SamplingStrategyResponse&>
            (mockAgent.
             super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(char (*) [13])"test-service",&config);
  std::__cxx11::string::string((string *)&rng,"test-service",&local_1f81);
  memcpy((IPAddress *)&device,
         mockAgent.
         super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         + 0x240,0x88);
  net::IPAddress::authority_abi_cxx11_(&local_1f28,(IPAddress *)&device);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f58,
                 "http://",&local_1f28);
  std::make_shared<jaegertracing::samplers::ProbabilisticSampler,double_const&>
            ((double *)&gtest_ar_);
  traceID._high = gtest_ar_._0_8_;
  traceID._low = (uint64_t)gtest_ar_.message_.ptr_;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  local_1f80 = 100000000;
  jaegertracing::samplers::RemotelyControlledSampler::RemotelyControlledSampler
            (&sampler,(string *)&rng,(string *)local_1f58,(shared_ptr *)&traceID,10,
             (duration *)&local_1f80,local_1f60,
             (Metrics *)
             metrics._M_t.
             super___uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::metrics::Metrics_*,_std::default_delete<jaegertracing::metrics::Metrics>_>
             .super__Head_base<0UL,_jaegertracing::metrics::Metrics_*,_false>._M_head_impl);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&traceID._low);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)local_1f58);
  std::__cxx11::string::~string((string *)&local_1f28);
  std::__cxx11::string::~string((string *)&rng);
  device.field_0.field_0._M_file = (void *)0x64;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&device);
  std::random_device::random_device(&device);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine(&rng);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&rng,(ulong)uVar1);
  lVar2 = std::chrono::_V2::steady_clock::now();
  do {
    lVar3 = std::chrono::_V2::steady_clock::now();
    if (999999999 < lVar3 - lVar2) {
      jaegertracing::samplers::RemotelyControlledSampler::close();
LAB_001d0e4b:
      std::random_device::~random_device(&device);
      RemotelyControlledSampler::~RemotelyControlledSampler(&sampler);
      jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::
      ~ProbabilisticSamplingStrategy(&probaStrategy);
      jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                (&config);
      std::
      unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
      ::~unique_ptr(&metrics);
      if (local_1f60 != (Logger *)0x0) {
        (*local_1f60->_vptr_Logger[1])();
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mockAgent.
                  super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      return;
    }
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()(&rng);
    traceID._low = std::
                   mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                   ::operator()(&rng);
    traceID._high = rVar4;
    std::__cxx11::string::string((string *)&local_1f28,"op",(allocator *)&local_1f80);
    jaegertracing::samplers::RemotelyControlledSampler::isSampled
              ((TraceID *)local_1f58,(string *)&sampler);
    gtest_ar_.success_ = (bool)local_1f58[0];
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
              ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(local_1f58 + 8));
    std::__cxx11::string::~string((string *)&local_1f28);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_1f28);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)local_1f58,&gtest_ar_.success_,
                 "sampler.isSampled(traceID, kTestOperationName).isSampled()","false");
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1f80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0x16d,(char *)local_1f58._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f80,(Message *)&local_1f28)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f80);
      std::__cxx11::string::~string((string *)local_1f58);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1f28);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      goto LAB_001d0e4b;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    local_1f58._0_8_ = (char *)0x14;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)local_1f58);
  } while( true );
}

Assistant:

TEST(Sampler, testRemotelyControlledSampler)
{
    const auto mockAgent = testutils::MockAgent::make();
    mockAgent->start();
    const auto logger = logging::nullLogger();
    const auto metrics = metrics::Metrics::makeNullMetrics();
            
    // Make sure remote sampling probability is 1
    sampling_manager::thrift::SamplingStrategyResponse config;
    config.__set_strategyType(
        sampling_manager::thrift::SamplingStrategyType::PROBABILISTIC);
    sampling_manager::thrift::ProbabilisticSamplingStrategy probaStrategy;
    probaStrategy.__set_samplingRate(1.0);
    config.__set_probabilisticSampling(probaStrategy);
    mockAgent->addSamplingStrategy("test-service", config);

    // Default probability of 0.5, switches to 1 when downloaded
    RemotelyControlledSampler sampler(
        "test-service",
        "http://" + mockAgent->samplingServerAddress().authority(),
        std::make_shared<ProbabilisticSampler>(kTestDefaultSamplingProbability),
        kTestDefaultMaxOperations,
        std::chrono::milliseconds(100),
        *logger,
        *metrics);
    
    // Wait a bit for remote config download to be done
    std::this_thread::sleep_for(std::chrono::milliseconds(100));
    std::random_device device;
    std::mt19937_64 rng;
    rng.seed(device());
    for (auto startTime = RemotelyControlledSampler::Clock::now();
         std::chrono::duration_cast<std::chrono::seconds>(
             RemotelyControlledSampler::Clock::now() - startTime)
             .count() < 1;) {
        TraceID traceID(rng(), rng());
        // If probability was 0.5 we could reasonnably assume one of 50 samples fail
        ASSERT_TRUE(sampler.isSampled(traceID, kTestOperationName).isSampled());
        std::this_thread::sleep_for(std::chrono::milliseconds(20));
    }
    sampler.close();
}